

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  size_t *psVar3;
  uint uVar4;
  ushort uVar5;
  char *pcVar6;
  long lVar7;
  basic_string_view<char,_std::char_traits<char>_> *pbVar8;
  ulong uVar9;
  group_type_pointer pgVar10;
  undefined1 auVar11 [16];
  
  pgVar10 = __return_storage_ptr__->pg;
  uVar9 = (ulong)__return_storage_ptr__->n;
  pbVar8 = __return_storage_ptr__->p;
  lVar7 = 1;
  while( true ) {
    pgVar1 = arrays_->groups_ + pos0;
    pgVar2 = arrays_->groups_ + pos0;
    auVar11[0] = -(pgVar2->m[0].n == '\0');
    auVar11[1] = -(pgVar2->m[1].n == '\0');
    auVar11[2] = -(pgVar2->m[2].n == '\0');
    auVar11[3] = -(pgVar2->m[3].n == '\0');
    auVar11[4] = -(pgVar2->m[4].n == '\0');
    auVar11[5] = -(pgVar2->m[5].n == '\0');
    auVar11[6] = -(pgVar2->m[6].n == '\0');
    auVar11[7] = -(pgVar2->m[7].n == '\0');
    auVar11[8] = -(pgVar2->m[8].n == '\0');
    auVar11[9] = -(pgVar2->m[9].n == '\0');
    auVar11[10] = -(pgVar2->m[10].n == '\0');
    auVar11[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar11[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar11[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar11[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar11[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar5 = (ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe;
    if (uVar5 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar4 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar9 = (ulong)uVar4;
      pbVar8 = (basic_string_view<char,_std::char_traits<char>_> *)
               ((long)&arrays_->elements_[pos0 * 0xf]._M_len + (ulong)(uVar4 << 4));
      pcVar6 = args->_M_str;
      psVar3 = (size_t *)((long)&arrays_->elements_[pos0 * 0xf]._M_len + (ulong)(uVar4 << 4));
      *psVar3 = args->_M_len;
      psVar3[1] = (size_t)pcVar6;
      pgVar1->m[uVar9].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar10 = pgVar1;
    }
    if (uVar5 != 0) break;
    pos0 = pos0 + lVar7 & arrays_->groups_size_mask;
    lVar7 = lVar7 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar9;
  __return_storage_ptr__->p = pbVar8;
  __return_storage_ptr__->pg = pgVar10;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }